

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O1

void __thiscall cmCTestBZR::LoadRevisions(cmCTestBZR *this)

{
  list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *this_00;
  cmCTest *pcVar1;
  char *__nptr;
  int iVar2;
  int iVar3;
  long *plVar4;
  _func_int **pp_Var5;
  char *bzr_log [8];
  string revs;
  OutputLogger err;
  ostringstream cmCTestLog_msg;
  char **local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  char *local_340;
  pointer local_338;
  undefined8 local_330;
  undefined1 *local_328;
  undefined8 local_320;
  undefined1 local_318;
  undefined7 uStack_317;
  OutputLogger local_308;
  undefined1 local_2c8 [664];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c8,"   Gathering version information (one . per revision):\n    ",
             0x3b);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBZR.cxx"
               ,0x1ba,(char *)local_368,false);
  if (local_368 != &local_358) {
    operator_delete(local_368,(ulong)(local_358 + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
  std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x70));
  this_00 = &(this->super_cmCTestGlobalVC).Revisions;
  std::__cxx11::_List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::_M_clear
            (&this_00->super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>);
  (this->super_cmCTestGlobalVC).Revisions.
  super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->super_cmCTestGlobalVC).Revisions.
  super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->super_cmCTestGlobalVC).Revisions.
  super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl._M_node.
  _M_size = 0;
  local_320 = 0;
  local_318 = 0;
  __nptr = (this->super_cmCTestGlobalVC).OldRevision._M_dataplus._M_p;
  local_328 = &local_318;
  iVar2 = atoi(__nptr);
  iVar3 = atoi((this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
  if (iVar2 <= iVar3) {
    local_368 = &local_358;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,__nptr,
               __nptr + (this->super_cmCTestGlobalVC).OldRevision._M_string_length);
    std::__cxx11::string::append((char *)&local_368);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_368,
                                (ulong)(this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
    pp_Var5 = (_func_int **)(plVar4 + 2);
    if ((_func_int **)*plVar4 == pp_Var5) {
      local_2c8._16_8_ = *pp_Var5;
      local_2c8._24_8_ = plVar4[3];
      local_2c8._0_8_ = local_2c8 + 0x10;
    }
    else {
      local_2c8._16_8_ = *pp_Var5;
      local_2c8._0_8_ = (_func_int **)*plVar4;
    }
    local_2c8._8_8_ = plVar4[1];
    *plVar4 = (long)pp_Var5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_328,(string *)local_2c8);
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
    }
    if (local_368 != &local_358) {
      operator_delete(local_368,(ulong)(local_358 + 1));
    }
    local_368 = (char **)(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus.
                         _M_p;
    local_360 = "log";
    local_358 = "-v";
    local_350 = "-r";
    local_348 = local_328;
    local_340 = "--xml";
    local_338 = (this->URL)._M_dataplus._M_p;
    local_330 = 0;
    LogParser::LogParser((LogParser *)local_2c8,this,"log-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              (&local_308,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> ");
    cmCTestVC::RunChild((cmCTestVC *)this,(char **)&local_368,(OutputParser *)local_2c8,
                        (OutputParser *)&local_308,(char *)0x0);
    local_308.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_006bc790;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_LineParser.Line._M_dataplus._M_p !=
        &local_308.super_LineParser.Line.field_2) {
      operator_delete(local_308.super_LineParser.Line._M_dataplus._M_p,
                      local_308.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    LogParser::~LogParser((LogParser *)local_2c8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
    std::ios::widen((char)(ostringstream *)local_2c8 +
                    (char)*(_func_int **)(local_2c8._0_8_ + -0x18));
    std::ostream::put((char)local_2c8);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBZR.cxx"
                 ,0x1d2,(char *)local_308.super_LineParser.super_OutputParser._vptr_OutputParser,
                 false);
    if (local_308.super_LineParser.super_OutputParser._vptr_OutputParser !=
        (_func_int **)&local_308.super_LineParser.Prefix) {
      operator_delete(local_308.super_LineParser.super_OutputParser._vptr_OutputParser,
                      (ulong)(local_308.super_LineParser.Prefix + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
    std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x70));
  }
  if (local_328 != &local_318) {
    operator_delete(local_328,CONCAT71(uStack_317,local_318) + 1);
  }
  return;
}

Assistant:

void cmCTestBZR::LoadRevisions()
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Gathering version information (one . per revision):\n"
             "    " << std::flush);

  // We are interested in every revision included in the update.
  this->Revisions.clear();
  std::string revs;
  if(atoi(this->OldRevision.c_str()) <= atoi(this->NewRevision.c_str()))
    {
    // DoRevision takes care of discarding the information about OldRevision
    revs = this->OldRevision + ".." + this->NewRevision;
    }
  else
    {
    return;
    }

  // Run "bzr log" to get all global revisions of interest.
  const char* bzr = this->CommandLineTool.c_str();
  const char* bzr_log[] = {bzr, "log", "-v", "-r", revs.c_str(), "--xml",
                           this->URL.c_str(), 0};
  {
  LogParser out(this, "log-out> ");
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(bzr_log, &out, &err);
  }
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl);
}